

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipUtilities.hpp
# Opt level: O2

string * __thiscall
Zippy::Impl::GenerateRandomName_abi_cxx11_(string *__return_storage_ptr__,Impl *this,int length)

{
  uint uVar1;
  result_type rVar2;
  bool bVar3;
  string result;
  string letters;
  uniform_int_distribution<int> distr;
  random_device rand_dev;
  mt19937 generator;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2780;
  long local_2760;
  int local_2758;
  uniform_int_distribution<int> local_2740;
  random_device local_2738;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2760,"abcdefghijklmnopqrstuvwxyz0123456789",
             (allocator<char> *)&local_2738);
  std::random_device::random_device(&local_2738);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13b0,(ulong)uVar1);
  local_2740._M_param._M_a = 0;
  local_2740._M_param._M_b = local_2758 + -1;
  local_2780._M_dataplus._M_p = (pointer)&local_2780.field_2;
  local_2780._M_string_length = 0;
  local_2780.field_2._M_local_buf[0] = '\0';
  uVar1 = ~((int)(uint)this >> 0x1f) & (uint)this;
  while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
    rVar2 = std::uniform_int_distribution<int>::operator()(&local_2740,&local_13b0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_2780,*(char *)(local_2760 + rVar2));
  }
  std::operator+(__return_storage_ptr__,&local_2780,".tmp");
  std::__cxx11::string::~string((string *)&local_2780);
  std::random_device::~random_device(&local_2738);
  std::__cxx11::string::~string((string *)&local_2760);
  return __return_storage_ptr__;
}

Assistant:

inline std::string GenerateRandomName(int length) {

        std::string letters = "abcdefghijklmnopqrstuvwxyz0123456789";

        std::random_device                 rand_dev;
        std::mt19937                       generator(rand_dev());
        std::uniform_int_distribution<int> distr(0, letters.size() - 1);

        std::string result;
        for (int    i       = 0; i < length; ++i) {
            result += letters[distr(generator)];
        }

        return result + ".tmp";
    }